

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O1

int64_t __thiscall
aeron::Publication::offer
          (Publication *this,AtomicBuffer *buffer,index_t offset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  int iVar1;
  AtomicBuffer *pAVar2;
  _Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
  this_00;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  uVar5 = 0xfffffffffffffffc;
  if (((this->m_isClosed)._M_base._M_i & 1U) == 0) {
    iVar1 = (this->m_publicationLimit).m_impl.m_offset;
    concurrent::AtomicBuffer::boundsCheck((AtomicBuffer *)&this->m_publicationLimit,iVar1,8);
    lVar9 = *(long *)((this->m_publicationLimit).m_impl.m_buffer.m_buffer + iVar1);
    pAVar2 = this->m_logMetaDataBuffer;
    concurrent::AtomicBuffer::boundsCheck(pAVar2,0x18,4);
    iVar1 = *(int *)(pAVar2->m_buffer + 0x18);
    this_00.super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>._M_head_impl
         = this->m_appenders[(long)iVar1 % 3]._M_t.
           super___uniq_ptr_impl<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
           ._M_t.
           super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
           .super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>;
    pAVar2 = *(AtomicBuffer **)
              ((long)this_00.
                     super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>.
                     _M_head_impl + 8);
    iVar10 = *(index_t *)
              ((long)this_00.
                     super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>.
                     _M_head_impl + 0x10);
    concurrent::AtomicBuffer::boundsCheck(pAVar2,iVar10,8);
    uVar3 = *(ulong *)(pAVar2->m_buffer + iVar10);
    lVar8 = ((long)uVar3 >> 0x20) - (long)this->m_initialTermId;
    uVar5 = 0xfffffffffffffffd;
    if (iVar1 == (int)lVar8) {
      lVar8 = (lVar8 << ((byte)this->m_positionBitsToShift & 0x3f)) + (uVar3 & 0xffffffff);
      if (lVar8 < lVar9) {
        iVar10 = (int)(uVar3 >> 0x20);
        if (this->m_maxPayloadLength < length) {
          checkMaxMessageLength(this,length);
          uVar4 = concurrent::logbuffer::TermAppender::appendFragmentedMessage
                            ((TermAppender *)
                             this_00.
                             super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>
                             ._M_head_impl,&this->m_headerWriter,buffer,offset,length,
                             this->m_maxPayloadLength,reservedValueSupplier,iVar10);
        }
        else {
          uVar4 = concurrent::logbuffer::TermAppender::appendUnfragmentedMessage
                            ((TermAppender *)
                             this_00.
                             super__Head_base<0UL,_aeron::concurrent::logbuffer::TermAppender_*,_false>
                             ._M_head_impl,&this->m_headerWriter,buffer,offset,length,
                             reservedValueSupplier,iVar10);
        }
        if ((int)uVar4 < 1) {
          uVar5 = 0xfffffffffffffffb;
          if (lVar8 + (int)uVar3 <= this->m_maxPossiblePosition) {
            pAVar2 = this->m_logMetaDataBuffer;
            lVar9 = (long)iVar1 + 1;
            iVar7 = (int)lVar9;
            lVar9 = (long)(iVar7 + (int)(lVar9 / 3) * -3) * 8;
            do {
              concurrent::AtomicBuffer::boundsCheck(pAVar2,(index_t)lVar9,8);
              lVar8 = *(long *)(pAVar2->m_buffer + lVar9);
              if (iVar10 + -2 != (int)((ulong)lVar8 >> 0x20)) break;
              concurrent::AtomicBuffer::boundsCheck(pAVar2,(index_t)lVar9,8);
              LOCK();
              lVar6 = *(long *)(pAVar2->m_buffer + lVar9);
              if (lVar8 == lVar6) {
                *(ulong *)(pAVar2->m_buffer + lVar9) = (uVar3 & 0xffffffff00000000) + 0x100000000;
                lVar6 = lVar8;
              }
              UNLOCK();
            } while (lVar6 != lVar8);
            concurrent::AtomicBuffer::boundsCheck(pAVar2,0x18,4);
            LOCK();
            if (iVar1 == *(int *)(pAVar2->m_buffer + 0x18)) {
              *(int *)(pAVar2->m_buffer + 0x18) = iVar7;
            }
            UNLOCK();
            uVar5 = 0xfffffffffffffffd;
          }
        }
        else {
          uVar5 = (ulong)uVar4 + (lVar8 - (int)uVar3);
        }
      }
      else {
        uVar5 = 0xfffffffffffffffb;
        if (lVar8 + length < this->m_maxPossiblePosition) {
          pAVar2 = this->m_logMetaDataBuffer;
          concurrent::AtomicBuffer::boundsCheck(pAVar2,0x88,4);
          uVar5 = ~(ulong)(*(int *)(pAVar2->m_buffer + 0x88) == 1);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

inline std::int64_t offer(
        const concurrent::AtomicBuffer& buffer,
        util::index_t offset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        std::int64_t newPosition = PUBLICATION_CLOSED;

        if (!isClosed())
        {
            const std::int64_t limit = m_publicationLimit.getVolatile();
            const std::int32_t termCount = LogBufferDescriptor::activeTermCount(m_logMetaDataBuffer);
            TermAppender *termAppender = m_appenders[LogBufferDescriptor::indexByTermCount(termCount)].get();
            const std::int64_t rawTail = termAppender->rawTailVolatile();
            const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
            const std::int32_t termId = LogBufferDescriptor::termId(rawTail);
            const std::int64_t position = LogBufferDescriptor::computeTermBeginPosition(
                termId, m_positionBitsToShift, m_initialTermId) + termOffset;

            if (termCount != (termId - m_initialTermId))
            {
                return ADMIN_ACTION;
            }

            if (position < limit)
            {
                std::int32_t resultingOffset;
                if (length <= m_maxPayloadLength)
                {
                    resultingOffset = termAppender->appendUnfragmentedMessage(
                        m_headerWriter, buffer, offset, length, reservedValueSupplier, termId);
                }
                else
                {
                    checkMaxMessageLength(length);
                    resultingOffset = termAppender->appendFragmentedMessage(
                        m_headerWriter, buffer, offset, length, m_maxPayloadLength, reservedValueSupplier, termId);
                }

                newPosition = Publication::newPosition(
                    termCount, static_cast<std::int32_t>(termOffset), termId, position, resultingOffset);
            }
            else
            {
                newPosition = Publication::backPressureStatus(position, length);
            }
        }

        return newPosition;
    }